

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fs_write_alotof_bufs_with_offset(int add_flags)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  uv_buf_t uVar8;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  __ptr = malloc(0xd4310);
  if (__ptr == (void *)0x0) {
    pcVar4 = "iovs";
    uVar2 = 0xd78;
LAB_0012c038:
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            uVar2,pcVar4,"!=","NULL",0,"!=",0);
    abort();
  }
  iVar1 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
  uVar8.len = iov.len;
  uVar8.base = iov.base;
  if (iVar1 < 0) {
    pcVar4 = "r >= 0";
    uVar2 = 0xd81;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar4 = "open_req1.result >= 0";
    uVar2 = 0xd82;
    iov = uVar8;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init("0123456789",10);
    iVar1 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff,0);
    if (iVar1 == 10) {
      if (write_req.result == 10) {
        uv_fs_req_cleanup(&write_req);
        for (lVar5 = 8; lVar5 != 0xd4318; lVar5 = lVar5 + 0x10) {
          auVar7 = uv_buf_init(test_buf,0xd);
          *(long *)((long)__ptr + lVar5 + -8) = auVar7._0_8_;
          *(long *)((long)__ptr + lVar5) = auVar7._8_8_;
        }
        iVar1 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,__ptr,0xd431,10,0);
        if (iVar1 < 0) {
          pcVar4 = "r >= 0";
          uVar2 = 0xd96;
        }
        else if (write_req.result == 0xac67d) {
          uv_fs_req_cleanup(&write_req);
          __ptr_00 = malloc(0xac67d);
          if (__ptr_00 == (void *)0x0) {
            pcVar4 = "buffer";
            uVar2 = 0xd9c;
            goto LAB_0012c038;
          }
          pvVar6 = __ptr_00;
          for (lVar5 = 8; lVar5 != 0xd4318; lVar5 = lVar5 + 0x10) {
            auVar7 = uv_buf_init(pvVar6,0xd);
            *(long *)((long)__ptr + lVar5 + -8) = auVar7._0_8_;
            *(long *)((long)__ptr + lVar5) = auVar7._8_8_;
            pvVar6 = (void *)((long)pvVar6 + 0xd);
          }
          iVar1 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,__ptr,0xd431,10,0);
          if (iVar1 < 0) {
            pcVar4 = "r >= 0";
            uVar2 = 0xda4;
          }
          else {
            lVar5 = 0x400;
            if (iVar1 == 0xd) {
              lVar5 = 1;
            }
            lVar3 = 0x3400;
            if (iVar1 == 0xd) {
              lVar3 = 0xd;
            }
            if (read_req.result == lVar3) {
              lVar3 = 0;
              do {
                if (lVar5 * 0xd + 0xd == lVar3 + 0xd) {
                  uv_fs_req_cleanup(&read_req);
                  free(__ptr_00);
                  iVar1 = uv_fs_stat(0,&stat_req,"test_file",0);
                  if (iVar1 == 0) {
                    if (*(long *)((long)stat_req.ptr + 0x38) == write_req.result + 10) {
                      uv_fs_req_cleanup(&stat_req);
                      uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
                      iov = uVar8;
                      iVar1 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,
                                         write_req.result + 10,0);
                      if (iVar1 == 0) {
                        if (read_req.result == 0) {
                          uv_fs_req_cleanup(&read_req);
                          iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
                          if (iVar1 == 0) {
                            if (close_req.result == 0) {
                              uv_fs_req_cleanup(&close_req);
                              unlink("test_file");
                              free(__ptr);
                              return;
                            }
                            pcVar4 = "close_req.result == 0";
                            uVar2 = 0xdc7;
                          }
                          else {
                            pcVar4 = "r == 0";
                            uVar2 = 0xdc6;
                          }
                        }
                        else {
                          pcVar4 = "read_req.result == 0";
                          uVar2 = 0xdc2;
                        }
                      }
                      else {
                        pcVar4 = "r == 0";
                        uVar2 = 0xdc1;
                      }
                    }
                    else {
                      pcVar4 = 
                      "(int64_t)((uv_stat_t*)stat_req.ptr)->st_size == offset + (int64_t)write_req.result"
                      ;
                      uVar2 = 0xdb6;
                    }
                  }
                  else {
                    pcVar4 = "r == 0";
                    uVar2 = 0xdb4;
                  }
                  goto LAB_0012bd80;
                }
                iVar1 = strncmp((char *)(lVar3 + (long)__ptr_00),test_buf,0xd);
                lVar3 = lVar3 + 0xd;
              } while (iVar1 == 0);
              pcVar4 = "strncmp(buffer + index * sizeof(test_buf), test_buf, sizeof(test_buf)) == 0"
              ;
              uVar2 = 0xdae;
            }
            else {
              pcVar4 = "(size_t)read_req.result == sizeof(test_buf) * iovcount";
              uVar2 = 0xda9;
            }
          }
        }
        else {
          pcVar4 = "(size_t)write_req.result == sizeof(test_buf) * iovcount";
          uVar2 = 0xd97;
        }
      }
      else {
        pcVar4 = "write_req.result == filler_len";
        uVar2 = 0xd88;
      }
    }
    else {
      pcVar4 = "r == filler_len";
      uVar2 = 0xd87;
    }
  }
LAB_0012bd80:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar2,pcVar4);
  abort();
}

Assistant:

static void fs_write_alotof_bufs_with_offset(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;
  int64_t offset;
  char* filler;
  int filler_len;

  filler = "0123456789";
  filler_len = strlen(filler);
  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(filler, filler_len);
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == filler_len);
  ASSERT(write_req.result == filler_len);
  uv_fs_req_cleanup(&write_req);
  offset = (int64_t)r;

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  offset,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_read(NULL, &read_req, open_req1.result,
                 iovs, iovcount, offset, NULL);
  ASSERT(r >= 0);
  if (r == sizeof(test_buf))
    iovcount = 1; /* Infer that preadv is not available. */
  else if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  r = uv_fs_stat(NULL, &stat_req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT((int64_t)((uv_stat_t*)stat_req.ptr)->st_size ==
         offset + (int64_t)write_req.result);
  uv_fs_req_cleanup(&stat_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 offset + write_req.result,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}